

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt64x2Operation.cpp
# Opt level: O0

void Js::SIMDInt64x2Operation::OpTrunc<unsigned_long>(SIMDValue *dst,SIMDValue *src)

{
  bool bVar1;
  ulong uVar2;
  Type local_30;
  Type local_28;
  Type local_20;
  unsigned_long convertedVal;
  SIMDValue *src_local;
  SIMDValue *dst_local;
  
  convertedVal = (unsigned_long)src;
  src_local = dst;
  bVar1 = IsInRange((src->field_0).f64[0],(uint64 *)&local_20);
  if (bVar1) {
    uVar2 = (ulong)*(double *)convertedVal;
    local_28 = (Type)(uVar2 | (long)(*(double *)convertedVal - 9.223372036854776e+18) &
                              (long)uVar2 >> 0x3f);
  }
  else {
    local_28 = local_20;
  }
  (src_local->field_0).f64[0] = local_28;
  bVar1 = IsInRange(*(double *)(convertedVal + 8),(uint64 *)&local_20);
  if (bVar1) {
    uVar2 = (ulong)*(double *)(convertedVal + 8);
    local_30 = (Type)(uVar2 | (long)(*(double *)(convertedVal + 8) - 9.223372036854776e+18) &
                              (long)uVar2 >> 0x3f);
  }
  else {
    local_30 = local_20;
  }
  (src_local->field_0).f64[1] = local_30;
  return;
}

Assistant:

void SIMDInt64x2Operation::OpTrunc(SIMDValue* dst, SIMDValue* src)
    {
        T convertedVal;
        dst->i64[0] = IsInRange(src->f64[0], convertedVal) ? (T)src->f64[0] : convertedVal;
        dst->i64[1] = IsInRange(src->f64[1], convertedVal) ? (T)src->f64[1] : convertedVal;
    }